

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O3

QString * __thiscall
QSslEllipticCurve::longName(QString *__return_storage_ptr__,QSslEllipticCurve *this)

{
  QTlsBackend *pQVar1;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar1 != (QTlsBackend *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x120))(&local_38,pQVar1,this->id);
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uStack_34;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_30;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_2c;
    (__return_storage_ptr__->d).size = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslEllipticCurve::longName() const
{
    QString name;

    if (const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse())
        name = tlsBackend->longNameForId(id);

    return name;
}